

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O2

void __thiscall KktChStep::printAR(KktChStep *this)

{
  pointer piVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  int j;
  int iVar5;
  int i;
  long lVar6;
  char buff [4];
  char local_34 [4];
  
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  for (lVar6 = 0; lVar6 < this->numCol; lVar6 = lVar6 + 1) {
    sprintf(local_34,"%2.1g ",
            (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,local_34);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"------AR-|-b-----\n");
  lVar6 = 0;
  do {
    if (this->RnumRow <= lVar6) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return;
    }
    for (iVar5 = 0; iVar5 < this->RnumCol; iVar5 = iVar5 + 1) {
      piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar2 = (long)piVar1[lVar6];
          (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2] != iVar5; lVar2 = lVar2 + 1) {
        if (piVar1[lVar6 + 1] <= lVar2) {
          pcVar4 = "   ";
          goto LAB_001506d8;
        }
      }
      pcVar4 = "   ";
      if ((int)lVar2 < piVar1[lVar6 + 1]) {
        sprintf(local_34,"%2.1g ",
                (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2]);
        pcVar4 = local_34;
      }
LAB_001506d8:
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,pcVar4);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"  |   ");
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 5;
    poVar3 = std::ostream::_M_insert<double>
                       ((this->RrowLower).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar3," < < ");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6]);
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void KktChStep::printAR() {
	char buff [4];
	cout<<"\n-----cost-----\n";

	for (int i=0;i<numCol;i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------AR-|-b-----\n";
	for (int i=0;i<RnumRow;i++) {
		for (int j=0;j<RnumCol;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1]) 
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{	
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
			
		}
		
		cout<<"  |   "<<std::setw(5)<<RrowLower[i]<<" < < "<<RrowUpper[i]<<endl;
		
	}
	
	cout<<endl;
}